

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O1

string * __thiscall
google::protobuf::internal::RepeatedPtrFieldStringAccessor::New_abi_cxx11_
          (RepeatedPtrFieldStringAccessor *this,Value *param_1)

{
  string *psVar1;
  
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  psVar1->_M_string_length = 0;
  (psVar1->field_2)._M_local_buf[0] = '\0';
  return psVar1;
}

Assistant:

std::string* New(const Value*) const override { return new std::string(); }